

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sound_Queue.cpp
# Opt level: O0

void __thiscall Sound_Queue::fill_buffer(Sound_Queue *this,Uint8 *out,int count)

{
  uint uVar1;
  sample_t *__src;
  int in_EDX;
  void *in_RSI;
  Sound_Queue *in_RDI;
  
  uVar1 = SDL_SemValue(in_RDI->free_sem);
  if (uVar1 < 2) {
    __src = buf(in_RDI,(int)((ulong)in_RSI >> 0x20));
    memcpy(in_RSI,__src,(long)in_EDX);
    in_RDI->read_buf = (in_RDI->read_buf + 1) % 3;
    SDL_SemPost(in_RDI->free_sem);
  }
  else {
    memset(in_RSI,0,(long)in_EDX);
  }
  return;
}

Assistant:

void Sound_Queue::fill_buffer( Uint8* out, int count )
{
	if ( SDL_SemValue( free_sem ) < buf_count - 1 )
	{
		memcpy( out, buf( read_buf ), count );
		read_buf = (read_buf + 1) % buf_count;
		SDL_SemPost( free_sem );
	}
	else
	{
		memset( out, 0, count );
	}
}